

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

void helper_call(CPUTriCoreState *env,uint32_t next_pc)

{
  uint uVar1;
  uint32_t uVar2;
  int iVar3;
  uint32_t uVar4;
  uintptr_t in_RCX;
  uint uVar5;
  uint32_t unaff_retaddr;
  uint32_t local_34;
  
  local_34 = psw_read(env);
  uVar1 = env->FCX;
  if (uVar1 == 0) {
    uVar2 = 4;
  }
  else if (((char)local_34 < '\0') && (iVar3 = cdc_increment(&local_34), iVar3 != 0)) {
    uVar2 = 2;
  }
  else {
    uVar2 = local_34;
    uVar5 = (uVar1 & 0xffff) << 6 | (uVar1 & 0xf0000) << 0xc;
    uVar4 = cpu_ldl_data_tricore(env,uVar5);
    save_context_upper(env,uVar5);
    uVar5 = ((env->ICR & 0x100) << 0xf | env->ICR << 0x18 | env->PCXI & 0x300000) +
            (env->FCX & 0xfffff) + 0x400000;
    in_RCX = (uintptr_t)uVar5;
    env->PCXI = uVar5;
    env->FCX = uVar4 & 0xfffff | env->FCX & 0xfff00000;
    env->gpr_a[0xb] = next_pc;
    if (uVar1 != env->LCX) {
      psw_write(env,uVar2 | 0x80);
      return;
    }
    uVar2 = 1;
  }
  raise_exception_sync_helper(env,uVar2,unaff_retaddr,in_RCX);
}

Assistant:

void helper_call(CPUTriCoreState *env, uint32_t next_pc)
{
    target_ulong tmp_FCX;
    target_ulong ea;
    target_ulong new_FCX;
    target_ulong psw;

    psw = psw_read(env);
    /* if (FCX == 0) trap(FCU); */
    if (env->FCX == 0) {
        /* FCU trap */
        raise_exception_sync_helper(env, TRAPC_CTX_MNG, TIN3_FCU, GETPC());
    }
    /* if (PSW.CDE) then if (cdc_increment()) then trap(CDO); */
    if (psw & MASK_PSW_CDE) {
        if (cdc_increment(&psw)) {
            /* CDO trap */
            raise_exception_sync_helper(env, TRAPC_CTX_MNG, TIN3_CDO, GETPC());
        }
    }
    /* PSW.CDE = 1;*/
    psw |= MASK_PSW_CDE;
    /* tmp_FCX = FCX; */
    tmp_FCX = env->FCX;
    /* EA = {FCX.FCXS, 6'b0, FCX.FCXO, 6'b0}; */
    ea = ((env->FCX & MASK_FCX_FCXS) << 12) +
         ((env->FCX & MASK_FCX_FCXO) << 6);
    /* new_FCX = M(EA, word); */
    new_FCX = cpu_ldl_data(env, ea);
    /* M(EA, 16 * word) = {PCXI, PSW, A[10], A[11], D[8], D[9], D[10], D[11],
                           A[12], A[13], A[14], A[15], D[12], D[13], D[14],
                           D[15]}; */
    save_context_upper(env, ea);

    /* PCXI.PCPN = ICR.CCPN; */
    env->PCXI = (env->PCXI & 0xffffff) +
                ((env->ICR & MASK_ICR_CCPN) << 24);
    /* PCXI.PIE = ICR.IE; */
    env->PCXI = ((env->PCXI & ~MASK_PCXI_PIE_1_3) +
                ((env->ICR & MASK_ICR_IE_1_3) << 15));
    /* PCXI.UL = 1; */
    env->PCXI |= MASK_PCXI_UL;

    /* PCXI[19: 0] = FCX[19: 0]; */
    env->PCXI = (env->PCXI & 0xfff00000) + (env->FCX & 0xfffff);
    /* FCX[19: 0] = new_FCX[19: 0]; */
    env->FCX = (env->FCX & 0xfff00000) + (new_FCX & 0xfffff);
    /* A[11] = next_pc[31: 0]; */
    env->gpr_a[11] = next_pc;

    /* if (tmp_FCX == LCX) trap(FCD);*/
    if (tmp_FCX == env->LCX) {
        /* FCD trap */
        raise_exception_sync_helper(env, TRAPC_CTX_MNG, TIN3_FCD, GETPC());
    }
    psw_write(env, psw);
}